

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

int __thiscall obx::ExpiredObjects::remove(ExpiredObjects *this,char *__filename)

{
  obx_err err_00;
  OBX_txn *pOVar1;
  undefined4 in_EDX;
  undefined8 uStack_28;
  obx_err err;
  size_t removedCount;
  char *pcStack_18;
  obx_schema_id typeId_local;
  Transaction *tx_local;
  ExpiredObjects *this_local;
  
  uStack_28 = 0;
  removedCount._4_4_ = in_EDX;
  pcStack_18 = __filename;
  tx_local = (Transaction *)this;
  pOVar1 = Transaction::cPtr((Transaction *)__filename);
  err_00 = obx_expired_objects_remove(pOVar1,removedCount._4_4_,&stack0xffffffffffffffd8);
  internal::checkErrOrThrow(err_00);
  return (int)uStack_28;
}

Assistant:

size_t ExpiredObjects::remove(obx::Transaction& tx, obx_schema_id typeId) {
    size_t removedCount = 0;
    obx_err err = obx_expired_objects_remove(tx.cPtr(), typeId, &removedCount);
    internal::checkErrOrThrow(err);
    return removedCount;
}